

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

vector<char,_std::allocator<char>_> * __thiscall
FBX::Decoder::readArray<char>
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,Decoder *this)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ulong __n;
  Span<char> local_48;
  vector<char,_std::allocator<char>_> local_38;
  
  pcVar4 = (this->stream).data;
  sVar5 = (this->stream).cursor;
  uVar2 = *(uint *)(pcVar4 + sVar5);
  iVar3 = *(int *)(pcVar4 + sVar5 + 4);
  sVar1 = sVar5 + 0xc;
  (this->stream).cursor = sVar1;
  __n = (ulong)*(uint *)(pcVar4 + sVar5 + 8);
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar3 == 1) {
    local_48.begin = pcVar4 + sVar1;
    local_48.end = local_48.begin + __n;
    (this->stream).cursor = sVar1 + __n;
    decompress<char>(&local_38,this,&local_48);
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  }
  else {
    (this->stream).cursor = sVar1 + __n;
    std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,(ulong)uVar2);
    memcpy((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start,pcVar4 + sVar1,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> Decoder::readArray() {
        size_t arraySize = stream.read<std::uint32_t>();
        size_t encoding = stream.read<std::uint32_t>();
        size_t completeLength = stream.read<std::uint32_t>();

        std::vector<T> buffer;
        if (encoding == 1)
            buffer = decompress<T>(stream.read<char>(completeLength));
        else {
            auto data = stream.read<T>(completeLength);
            buffer.resize(arraySize);
            std::memcpy(buffer.data(), data.begin, data.size() * sizeof(T));
        }

        return buffer;
    }